

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions.c
# Opt level: O0

_InstInfo * inst_vex_mod_lookup(_CodeInfo *ci,_InstNode in,_InstInfo *ii,uint index)

{
  int in_ECX;
  _InstInfo *in_RDX;
  _InstNode in_SI;
  long in_RDI;
  _InstInfo *local_8;
  
  *(long *)(in_RDI + 0x18) = *(long *)(in_RDI + 0x18) + 1;
  *(int *)(in_RDI + 0x20) = *(int *)(in_RDI + 0x20) + -1;
  if (*(int *)(in_RDI + 0x20) < 0) {
    local_8 = (_InstInfo *)0x0;
  }
  else {
    local_8 = in_RDX;
    if (**(byte **)(in_RDI + 0x18) < 0xc0) {
      local_8 = inst_get_info(in_SI,in_ECX + 4);
    }
  }
  return local_8;
}

Assistant:

static _InstInfo* inst_vex_mod_lookup(_CodeInfo* ci, _InstNode in, _InstInfo* ii, unsigned int index)
{
	/* Advance to read the MOD from ModRM byte. */
	ci->code += 1;
	ci->codeLen -= 1;
	if (ci->codeLen < 0) return NULL;
	if (*ci->code < INST_DIVIDED_MODRM) {
		/* MOD is not 11, therefore change the index to 8 - 12 range in the prefixed table. */
		index += 4;
		/* Make a second lookup for this special instruction. */
		return inst_get_info(in, index);
	}
	/* Return the original one, in case we didn't find a suited instruction. */
	return ii;
}